

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_reader.h
# Opt level: O2

void MyGame_Example_Any_sort(MyGame_Example_Any_mutable_union_t u)

{
  float fVar1;
  uint uVar2;
  flatbuffers_uoffset_t fVar3;
  Fantasy_Rapunzel_t FVar4;
  MyGame_Example_MultipleKeys_vec_t vec__tmp;
  Fantasy_Rapunzel_vec_t vec__tmp_00;
  flatbuffers_string_vec_t vec__tmp_01;
  flatbuffers_float_vec_t vec__tmp_02;
  MyGame_Example_Monster_mutable_table_t t__tmp;
  int iVar5;
  size_t i__tmp;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  size_t sVar9;
  bool bVar10;
  MyGame_Example_Any_mutable_union_t u_00;
  MyGame_Example_Any_union_vec_t uv__tmp;
  MyGame_Example_Any_union_t MVar11;
  
  t__tmp = (MyGame_Example_Monster_mutable_table_t)u.value;
  if (u.type == '\x04') {
    if (t__tmp != (MyGame_Example_Monster_mutable_table_t)0x0) {
      uv__tmp = MyGame_Example_Alt_manyany_union((MyGame_Example_Alt_table_t)t__tmp);
      if (uv__tmp.type == (flatbuffers_union_type_t *)0x0) {
        sVar9 = 0;
      }
      else {
        sVar9 = (size_t)*(uint *)(uv__tmp.type + -4);
      }
      for (i__tmp = 0; sVar9 != i__tmp; i__tmp = i__tmp + 1) {
        MVar11 = MyGame_Example_Any_union_vec_at(uv__tmp,i__tmp);
        u_00._1_7_ = 0;
        u_00.type = MVar11.type;
        u_00.value = MVar11.value;
        MyGame_Example_Any_sort(u_00);
      }
      vec__tmp = MyGame_Example_Alt_multik_get((MyGame_Example_Alt_table_t)t__tmp);
      if (vec__tmp != (MyGame_Example_MultipleKeys_vec_t)0x0) {
        uVar2 = vec__tmp[-1];
        uVar8 = (ulong)uVar2;
        if (uVar8 != 0) {
          uVar6 = (ulong)(uVar2 >> 1);
          do {
            __MyGame_Example_MultipleKeys_sort_by_foobar__heap_sift_down(vec__tmp,uVar6,uVar8 - 1);
            bVar10 = uVar6 != 0;
            uVar6 = uVar6 - 1;
          } while (bVar10);
          iVar5 = uVar2 * -4;
          iVar7 = uVar2 * 4;
          for (sVar9 = uVar8 - 2; iVar5 = iVar5 + 4, iVar7 = iVar7 + -4, sVar9 != 0xffffffffffffffff
              ; sVar9 = sVar9 - 1) {
            fVar3 = *vec__tmp;
            *vec__tmp = vec__tmp[sVar9 + 1] + iVar7;
            vec__tmp[sVar9 + 1] = fVar3 + iVar5;
            __MyGame_Example_MultipleKeys_sort_by_foobar__heap_sift_down(vec__tmp,0,sVar9);
          }
        }
      }
      vec__tmp_00 = MyGame_Example_Alt_rapunzels_get((MyGame_Example_Alt_table_t)t__tmp);
      if (vec__tmp_00 != (Fantasy_Rapunzel_vec_t)0x0) {
        uVar8 = (ulong)*(uint *)vec__tmp_00[-1].__deprecated0;
        if (uVar8 != 0) {
          uVar6 = (ulong)(*(uint *)vec__tmp_00[-1].__deprecated0 >> 1);
          do {
            __Fantasy_Rapunzel_sort_by_hair_length__heap_sift_down(vec__tmp_00,uVar6,uVar8 - 1);
            bVar10 = uVar6 != 0;
            uVar6 = uVar6 - 1;
          } while (bVar10);
          for (sVar9 = uVar8 - 2; sVar9 != 0xffffffffffffffff; sVar9 = sVar9 - 1) {
            FVar4 = vec__tmp_00[sVar9 + 1];
            vec__tmp_00[sVar9 + 1] = *vec__tmp_00;
            *vec__tmp_00 = FVar4;
            __Fantasy_Rapunzel_sort_by_hair_length__heap_sift_down(vec__tmp_00,0,sVar9);
          }
        }
      }
      vec__tmp_01 = MyGame_Example_Alt_names_get((MyGame_Example_Alt_table_t)t__tmp);
      if (vec__tmp_01 != (flatbuffers_string_vec_t)0x0) {
        uVar2 = vec__tmp_01[-1];
        uVar8 = (ulong)uVar2;
        if (uVar8 != 0) {
          uVar6 = (ulong)(uVar2 >> 1);
          do {
            __flatbuffers_string__heap_sift_down(vec__tmp_01,uVar6,uVar8 - 1);
            bVar10 = uVar6 != 0;
            uVar6 = uVar6 - 1;
          } while (bVar10);
          iVar5 = uVar2 * -4;
          iVar7 = uVar2 * 4;
          for (sVar9 = uVar8 - 2; iVar5 = iVar5 + 4, iVar7 = iVar7 + -4, sVar9 != 0xffffffffffffffff
              ; sVar9 = sVar9 - 1) {
            fVar3 = *vec__tmp_01;
            *vec__tmp_01 = vec__tmp_01[sVar9 + 1] + iVar7;
            vec__tmp_01[sVar9 + 1] = fVar3 + iVar5;
            __flatbuffers_string__heap_sift_down(vec__tmp_01,0,sVar9);
          }
        }
      }
      vec__tmp_02 = MyGame_Example_Alt_samples_get((MyGame_Example_Alt_table_t)t__tmp);
      if (vec__tmp_02 != (flatbuffers_float_vec_t)0x0) {
        uVar8 = (ulong)(uint)vec__tmp_02[-1];
        if (uVar8 != 0) {
          uVar6 = (ulong)((uint)vec__tmp_02[-1] >> 1);
          do {
            __flatbuffers_float__heap_sift_down(vec__tmp_02,uVar6,uVar8 - 1);
            bVar10 = uVar6 != 0;
            uVar6 = uVar6 - 1;
          } while (bVar10);
          for (sVar9 = uVar8 - 2; sVar9 != 0xffffffffffffffff; sVar9 = sVar9 - 1) {
            fVar1 = vec__tmp_02[sVar9 + 1];
            vec__tmp_02[sVar9 + 1] = *vec__tmp_02;
            *vec__tmp_02 = fVar1;
            __flatbuffers_float__heap_sift_down(vec__tmp_02,0,sVar9);
          }
        }
      }
    }
  }
  else if (u.type == '\x01') {
    MyGame_Example_Monster_sort(t__tmp);
    return;
  }
  return;
}

Assistant:

static void MyGame_Example_Any_sort(MyGame_Example_Any_mutable_union_t u)
{
    switch (u.type) {
    case MyGame_Example_Any_Monster: MyGame_Example_Monster_sort(u.value); break;
    case MyGame_Example_Any_Alt: MyGame_Example_Alt_sort(u.value); break;
    default: break;
    }
}